

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleNamespace.cpp
# Opt level: O3

PropertyQueryFlags __thiscall
Js::ModuleNamespace::GetPropertyQuery
          (ModuleNamespace *this,Var originalInstance,JavascriptString *propertyNameString,
          Var *value,PropertyValueInfo *info,ScriptContext *requestContext)

{
  int iVar1;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  
  local_40 = (PropertyRecord *)0x0;
  propertyRecord = (PropertyRecord *)requestContext;
  ScriptContext::GetOrAddPropertyRecord
            ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr,propertyNameString,&local_40);
  iVar1 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x12])
                    (this,originalInstance,(ulong)(uint)local_40->pid,value,info,propertyRecord);
  return (PropertyQueryFlags)(iVar1 == 1);
}

Assistant:

PropertyQueryFlags ModuleNamespace::GetPropertyQuery(Var originalInstance, JavascriptString* propertyNameString, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        const PropertyRecord* propertyRecord = nullptr;
        GetScriptContext()->GetOrAddPropertyRecord(propertyNameString, &propertyRecord);
        return JavascriptConversion::BooleanToPropertyQueryFlags(GetProperty(originalInstance, propertyRecord->GetPropertyId(), value, info, requestContext));
    }